

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

int exhaustive_parse(Parser *p,int state)

{
  uint32 *puVar1;
  d_loc_t *start_loc;
  char *pcVar2;
  uint *puVar3;
  Shift **ppSVar4;
  Shift **ppSVar5;
  anon_struct_40_4_d8687ec6_for_error_reductions *v;
  int *piVar6;
  char cVar7;
  char cVar8;
  unsigned_short uVar9;
  undefined2 uVar10;
  char *pcVar11;
  D_ErrorRecoveryHint *pDVar12;
  char *pcVar13;
  SNode *pSVar14;
  D_Reduction **ppDVar15;
  PNode *pPVar16;
  SNode **ppSVar17;
  SNode **ppSVar18;
  D_State *pDVar19;
  long lVar20;
  d_loc_t *pdVar21;
  bool bVar22;
  Shift *__ptr;
  char *pcVar23;
  D_ErrorRecoveryHint *pDVar24;
  Shift *pSVar25;
  uint uVar26;
  int iVar27;
  SNode *pSVar28;
  PNode *pPVar29;
  ZNode *pZVar30;
  void *__ptr_00;
  size_t sVar31;
  ZNode **ppZVar32;
  D_Reduction *elem;
  Reduction *pRVar33;
  ZNode *pZVar34;
  ShiftResult *pSVar35;
  D_Shift *pDVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  D_ErrorRecoveryHint *pDVar40;
  Shift *pSVar41;
  D_Shift **ppDVar42;
  int iVar43;
  Shift *__ptr_01;
  long lVar44;
  VecSNode *v_00;
  ShiftResult *pSVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  int iVar49;
  uint uVar50;
  ulong uVar51;
  Shift **ppSVar52;
  Shift *pSVar53;
  char *pcVar54;
  D_Shift **ppDVar55;
  ulong uVar56;
  long *plVar57;
  d_loc_t loc_1;
  d_loc_t loc;
  PNode tpn;
  SNode *local_1e0;
  char *local_1c0;
  char *local_1b0;
  D_ErrorRecoveryHint *local_198;
  d_loc_t local_188;
  D_Reduction **local_160;
  d_loc_t local_158;
  ulong local_138;
  char *local_130;
  d_loc_t local_128;
  PNode local_108;
  
  pcVar11 = p->start;
  (p->user).loc.s = pcVar11;
  (p->user).loc.ws = pcVar11;
  local_128.ws = (p->user).loc.ws;
  local_128.col = (p->user).loc.col;
  local_128.line = (p->user).loc.line;
  local_128.s = (p->user).loc.s;
  local_128.pathname = (p->user).loc.pathname;
  (*(p->user).initial_white_space_fn)(&p->user,&local_128,(void **)p);
  pSVar28 = add_SNode(p,p->t->state + state,&local_128,p->top_scope);
  memset(&local_108,0,0xd8);
  local_108.initial_scope = p->top_scope;
  local_108.parse_node.end = local_128.s;
  pPVar29 = pSVar28->last_pn;
  local_108.parse_node.scope = local_108.initial_scope;
  if (pPVar29 != (PNode *)0x0) {
    puVar1 = &pPVar29->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pPVar29);
    }
  }
  start_loc = &(p->user).loc;
  pPVar29 = add_PNode(p,0,&local_128,local_128.s,&local_108,(D_Reduction *)0x0,(VecZNode *)0x0,
                      (D_Shift *)0x0);
  pPVar29->refcount = pPVar29->refcount + 1;
  pSVar28->last_pn = pPVar29;
  pZVar30 = new_ZNode(p,pPVar29);
  set_add_znode(&pSVar28->zns,pZVar30);
  ppSVar5 = &p->shifts_todo;
  v = &p->error_reductions;
  local_160 = (p->error_reductions).e;
  local_1c0 = (char *)0x0;
  iVar43 = 0;
LAB_00142256:
  do {
    pRVar33 = p->reductions_todo;
    if (pRVar33 != (Reduction *)0x0) {
      while( true ) {
        pcVar11 = (pRVar33->snode->loc).s;
        if ((*ppSVar5 != (Shift *)0x0) && (((*ppSVar5)->snode->loc).s < pcVar11)) break;
        if (local_1c0 < pcVar11) {
          free_old_nodes(p);
          pRVar33 = p->reductions_todo;
          local_1c0 = pcVar11;
          goto joined_r0x0014229c;
        }
        while ((pRVar33->snode->loc).s == pcVar11) {
          p->reductions_todo = pRVar33->next;
          reduce_one(p,pRVar33);
          pRVar33 = p->reductions_todo;
joined_r0x0014229c:
          if (pRVar33 == (Reduction *)0x0) goto LAB_001422ca;
        }
      }
    }
LAB_001422ca:
    __ptr_01 = *ppSVar5;
    if (__ptr_01 == (Shift *)0x0) {
      if (p->accept != (SNode *)0x0) {
        if ((p->accept->loc).s == p->end) {
          return 0;
        }
        if ((p->user).partial_parses != 0) {
          return 0;
        }
      }
      pSVar28 = (p->snode_hash).last_all;
      if (pSVar28 == (SNode *)0x0) {
        return 1;
      }
      pcVar11 = (pSVar28->loc).s;
      pcVar13 = (pSVar28->loc).pathname;
      iVar39 = (pSVar28->loc).col;
      iVar49 = (pSVar28->loc).line;
      (p->user).loc.ws = (pSVar28->loc).ws;
      (p->user).loc.col = iVar39;
      (p->user).loc.line = iVar49;
      start_loc->s = pcVar11;
      (p->user).loc.pathname = pcVar13;
      if ((p->user).error_recovery == 0) {
        return 1;
      }
      __ptr_00 = malloc(80000);
      iVar39 = (p->user).loc.line;
      if (p->last_syntax_error_line < iVar39) {
        p->last_syntax_error_line = iVar39;
        piVar6 = &(p->user).syntax_errors;
        *piVar6 = *piVar6 + 1;
        (*(p->user).syntax_error_fn)(&p->user);
        pSVar28 = (p->snode_hash).last_all;
        if (pSVar28 == (SNode *)0x0) goto LAB_0014301a;
      }
      uVar50 = 0;
      do {
        if (-1 < (int)*(uint *)&pSVar28->field_0x24) {
          *(uint *)&pSVar28->field_0x24 = *(uint *)&pSVar28->field_0x24 | 0x80000000;
          if (uVar50 < 9999) {
            uVar51 = (ulong)uVar50;
            uVar50 = uVar50 + 1;
            *(SNode **)((long)__ptr_00 + uVar51 * 8) = pSVar28;
          }
          else {
            exhaustive_parse_cold_1();
          }
        }
        pSVar28 = pSVar28->all_next;
      } while (pSVar28 != (SNode *)0x0);
      if (uVar50 == 0) goto LAB_0014301a;
      pcVar11 = (((p->snode_hash).last_all)->loc).s;
      local_130 = pcVar11 + 1;
      uVar51 = 0;
      local_1e0 = (SNode *)0x0;
      local_1b0 = (char *)0x0;
      local_198 = (D_ErrorRecoveryHint *)0x0;
      do {
        pSVar28 = *(SNode **)((long)__ptr_00 + uVar51 * 8);
        uVar56 = (ulong)(pSVar28->state->error_recovery_hints).n;
        local_138 = uVar51;
        if (uVar56 != 0) {
          pDVar12 = (pSVar28->state->error_recovery_hints).v;
          cVar7 = *pcVar11;
          uVar51 = 0;
          do {
            pcVar13 = pDVar12[uVar51].string;
            sVar31 = strlen(pcVar13);
            uVar47 = sVar31 & 0xffffffff;
            pcVar54 = pcVar11;
            cVar8 = cVar7;
            pSVar14 = local_1e0;
            pcVar23 = local_1b0;
            pDVar24 = local_198;
            if (uVar47 == 1) {
              pcVar2 = pcVar11;
              pcVar54 = local_130;
              while (cVar8 != '\0') {
                if (cVar8 == *pcVar13) goto LAB_001424ca;
                cVar8 = *pcVar54;
                pcVar2 = pcVar54;
                pcVar54 = pcVar54 + 1;
              }
              if (*pcVar13 == '\0') {
                pcVar54 = pcVar2 + 1;
LAB_001424ca:
                pDVar40 = pDVar12 + uVar51;
                pSVar14 = pSVar28;
                pcVar23 = pcVar54;
                pDVar24 = pDVar40;
                if ((((local_1e0 != (SNode *)0x0) && (local_1b0 <= pcVar54)) &&
                    (pSVar14 = local_1e0, pcVar23 = local_1b0, pDVar24 = local_198,
                    pcVar54 == local_1b0)) &&
                   (((uVar26 = *(uint *)&local_1e0->field_0x24 & 0x7fffffff,
                     uVar37 = *(uint *)&pSVar28->field_0x24 & 0x7fffffff, pSVar14 = pSVar28,
                     pcVar23 = pcVar54, pDVar24 = pDVar40, uVar37 <= uVar26 &&
                     (pSVar14 = local_1e0, pcVar23 = local_1b0, pDVar24 = local_198,
                     uVar26 == uVar37)) &&
                    (pSVar14 = pSVar28, pcVar23 = pcVar54, pDVar24 = pDVar40,
                    pDVar40->depth <= local_198->depth)))) {
                  pSVar14 = local_1e0;
                  pcVar23 = local_1b0;
                  pDVar24 = local_198;
                }
              }
            }
            else {
              while (cVar8 != '\0') {
                iVar39 = strncmp(pcVar13,pcVar54,uVar47);
                if (iVar39 == 0) {
                  pcVar54 = pcVar54 + uVar47;
                  goto LAB_001424ca;
                }
                pcVar2 = pcVar54 + 1;
                pcVar54 = pcVar54 + 1;
                cVar8 = *pcVar2;
              }
            }
            local_198 = pDVar24;
            local_1b0 = pcVar23;
            local_1e0 = pSVar14;
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar56);
        }
        uVar38 = (pSVar28->zns).n;
        if (uVar38 != 0) {
          ppZVar32 = (pSVar28->zns).v;
          uVar51 = 0;
          do {
            if ((ppZVar32[uVar51] != (ZNode *)0x0) &&
               (pZVar30 = ppZVar32[uVar51], (pZVar30->sns).n != 0)) {
              uVar56 = 0;
              do {
                pSVar14 = (pZVar30->sns).v[uVar56];
                if (-1 < (int)*(uint *)&pSVar14->field_0x24) {
                  *(uint *)&pSVar14->field_0x24 = *(uint *)&pSVar14->field_0x24 | 0x80000000;
                  if (uVar50 < 9999) {
                    uVar47 = (ulong)uVar50;
                    uVar50 = uVar50 + 1;
                    *(SNode **)((long)__ptr_00 + uVar47 * 8) = pSVar14;
                  }
                  else {
                    exhaustive_parse_cold_2();
                  }
                }
                uVar56 = uVar56 + 1;
                ppZVar32 = (pSVar28->zns).v;
                pZVar30 = ppZVar32[uVar51];
              } while (uVar56 < (pZVar30->sns).n);
              uVar38 = (pSVar28->zns).n;
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 < uVar38);
        }
        uVar51 = local_138 + 1;
      } while (uVar51 < uVar50);
      if (uVar50 != 0) {
        uVar51 = 0;
        do {
          puVar3 = (uint *)(*(long *)((long)__ptr_00 + uVar51 * 8) + 0x24);
          *puVar3 = *puVar3 & 0x7fffffff;
          uVar51 = uVar51 + 1;
        } while (uVar50 != uVar51);
      }
      if (local_1e0 == (SNode *)0x0) goto LAB_0014301a;
      elem = (D_Reduction *)calloc(1,0x38);
      pRVar33 = (Reduction *)malloc(0x30);
      local_188.s = start_loc->s;
      local_188.pathname = (p->user).loc.pathname;
      local_188.ws = (p->user).loc.ws;
      local_188.col = (p->user).loc.col;
      local_188.line = (p->user).loc.line;
      ppDVar15 = (p->error_reductions).v;
      if (ppDVar15 == (D_Reduction **)0x0) {
        (p->error_reductions).v = local_160;
        uVar50 = (p->error_reductions).n;
        (p->error_reductions).n = uVar50 + 1;
        (p->error_reductions).e[uVar50] = elem;
      }
      else {
        uVar50 = v->n;
        if (ppDVar15 == local_160) {
          if (2 < uVar50) goto LAB_0014269f;
        }
        else if ((uVar50 & 7) == 0) {
LAB_0014269f:
          vec_add_internal(v,elem);
          goto LAB_001426ac;
        }
        v->n = uVar50 + 1;
        ppDVar15[uVar50] = elem;
      }
LAB_001426ac:
      uVar10 = local_198->depth;
      elem->nelements = uVar10 + 1;
      elem->symbol = local_198->symbol;
      if (local_188.s < local_1b0) {
        iVar39 = local_188.line;
        do {
          if (*local_188.s == '\n') {
            iVar39 = iVar39 + 1;
            local_188.line = iVar39;
          }
          local_188.s = local_188.s + 1;
        } while (local_188.s != local_1b0);
      }
      local_188.s = local_1b0;
      uVar51 = (ulong)(local_1e0->zns).n;
      if (uVar51 == 0) {
        pPVar29 = (PNode *)0x0;
      }
      else {
        uVar56 = 0;
        pPVar29 = (PNode *)0x0;
        do {
          pZVar30 = (local_1e0->zns).v[uVar56];
          if ((pZVar30 != (ZNode *)0x0) &&
             ((pPVar16 = pZVar30->pn, pPVar29 == (PNode *)0x0 ||
              ((pPVar29->parse_node).start_loc.s < (pPVar16->parse_node).start_loc.s)))) {
            pPVar29 = pPVar16;
          }
          uVar56 = uVar56 + 1;
        } while (uVar51 != uVar56);
      }
      (*(p->user).initial_white_space_fn)(&p->user,&local_188,(void **)p);
      pPVar29 = add_PNode(p,0,start_loc,local_188.s,pPVar29,(D_Reduction *)0x0,(VecZNode *)0x0,
                          (D_Shift *)0x0);
      pSVar28 = new_SNode(p,local_1e0->state,&local_188,pPVar29->initial_scope);
      pPVar29->refcount = pPVar29->refcount + 1;
      pSVar28->last_pn = pPVar29;
      pZVar30 = new_ZNode(p,pPVar29);
      set_add_znode(&pSVar28->zns,pZVar30);
      ppSVar17 = (pZVar30->sns).v;
      ppSVar18 = (pZVar30->sns).e;
      if (ppSVar17 == (SNode **)0x0) {
        (pZVar30->sns).v = ppSVar18;
        uVar50 = (pZVar30->sns).n;
        (pZVar30->sns).n = uVar50 + 1;
        (pZVar30->sns).e[uVar50] = local_1e0;
      }
      else {
        v_00 = &pZVar30->sns;
        uVar50 = v_00->n;
        if (ppSVar17 == ppSVar18) {
          if (2 < uVar50) goto LAB_00142844;
        }
        else if ((uVar50 & 7) == 0) {
LAB_00142844:
          vec_add_internal(v_00,local_1e0);
          goto LAB_00142851;
        }
        v_00->n = uVar50 + 1;
        ppSVar17[uVar50] = local_1e0;
      }
LAB_00142851:
      local_1e0->refcount = local_1e0->refcount + 1;
      pRVar33->znode = pZVar30;
      pSVar28->refcount = pSVar28->refcount + 1;
      pRVar33->snode = pSVar28;
      pRVar33->reduction = elem;
      pRVar33->new_snode = (SNode *)0x0;
      pRVar33->next = (Reduction *)0x0;
      free_old_nodes(p);
      free_old_nodes(p);
      reduce_one(p,pRVar33);
      uVar51 = (ulong)(p->snode_hash).m;
      if (uVar51 != 0) {
        ppSVar18 = (p->snode_hash).v;
        uVar56 = 0;
        do {
          for (pSVar28 = ppSVar18[uVar56]; pSVar28 != (SNode *)0x0; pSVar28 = pSVar28->bucket_next)
          {
            uVar47 = (ulong)(pSVar28->zns).n;
            if (uVar47 != 0) {
              ppZVar32 = (pSVar28->zns).v;
              uVar46 = 0;
              do {
                pZVar30 = ppZVar32[uVar46];
                if ((pZVar30 != (ZNode *)0x0) && (pPVar29 = pZVar30->pn, pPVar29->reduction == elem)
                   ) {
                  pPVar29->evaluated = '\x01';
                  pPVar29->error_recovery = '\x01';
                }
                uVar46 = uVar46 + 1;
              } while (uVar47 != uVar46);
            }
          }
          uVar56 = uVar56 + 1;
        } while (uVar56 != uVar51);
      }
      if ((*ppSVar5 == (Shift *)0x0) && (p->reductions_todo == (Reduction *)0x0)) {
LAB_0014301a:
        free(__ptr_00);
        return 1;
      }
      free(__ptr_00);
      goto LAB_00142256;
    }
    if (((p->user).dont_compare_stacks == 0) && (__ptr_01->next != (Shift *)0x0)) {
      pcVar11 = (__ptr_01->snode->loc).s;
      ppSVar52 = ppSVar5;
      do {
        pSVar28 = __ptr_01->snode;
        if ((pSVar28->loc).s != pcVar11) break;
        pZVar30 = binary_op_ZNode(pSVar28);
        if (pZVar30 != (ZNode *)0x0) {
          pSVar53 = __ptr_01->next;
          pSVar25 = pSVar53;
          pSVar41 = __ptr_01;
          while (__ptr = pSVar25, __ptr != (Shift *)0x0) {
            pSVar14 = __ptr->snode;
            if ((pSVar14->loc).s != pcVar11) break;
            pZVar34 = binary_op_ZNode(pSVar14);
            if ((pZVar34 != (ZNode *)0x0) &&
               (uVar50 = (pZVar30->sns).n, uVar51 = (ulong)uVar50, uVar50 == (pZVar34->sns).n)) {
              if (uVar51 != 0) {
                uVar56 = 0;
                do {
                  uVar47 = 0;
                  while ((pZVar30->sns).v[uVar56] != (pZVar34->sns).v[uVar47]) {
                    uVar47 = uVar47 + 1;
                    if (uVar51 == uVar47) goto LAB_00142a45;
                  }
                  uVar56 = uVar56 + 1;
                } while (uVar56 != uVar51);
              }
              pDVar19 = p->t->state;
              if ((((long)pSVar14->state - (long)pDVar19 >> 3) * -0x1111111111111111 -
                   (long)pSVar28->state->reduces_to == 0) ||
                 (((long)pSVar28->state - (long)pDVar19 >> 3) * -0x1111111111111111 -
                  (long)pSVar14->state->reduces_to == 0)) {
                iVar39 = pZVar34->pn->op_priority;
                iVar49 = pZVar30->pn->op_priority;
                if (iVar39 < iVar49) {
                  pSVar41->next = __ptr->next;
                  pSVar28 = __ptr->snode;
                  puVar1 = &pSVar28->refcount;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    free_SNode(p,pSVar28);
                  }
                  free(__ptr);
                  break;
                }
                if (iVar49 < iVar39) {
                  *ppSVar52 = pSVar53;
                  pSVar28 = __ptr_01->snode;
                  puVar1 = &pSVar28->refcount;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    free_SNode(p,pSVar28);
                  }
                  free(__ptr_01);
                  __ptr_01 = *ppSVar52;
                  break;
                }
              }
            }
LAB_00142a45:
            pSVar41 = __ptr;
            pSVar25 = __ptr->next;
          }
        }
        ppSVar4 = &__ptr_01->next;
        ppSVar52 = &__ptr_01->next;
        __ptr_01 = *ppSVar4;
      } while (*ppSVar4 != (Shift *)0x0);
      __ptr_01 = *ppSVar5;
    }
    pcVar11 = (__ptr_01->snode->loc).s;
    if (local_1c0 < pcVar11) {
      free_old_nodes(p);
      __ptr_01 = p->shifts_todo;
      local_1c0 = pcVar11;
    }
    iVar39 = iVar43 + 1;
    if (iVar43 < (p->user).commit_actions_interval) {
LAB_00142b23:
      bVar22 = false;
    }
    else {
      if ((__ptr_01->next == (Shift *)0x0) && (p->reductions_todo == (Reduction *)0x0)) {
        iVar43 = commit_stack(p,__ptr_01->snode);
        if (iVar43 == -4) {
          return -1;
        }
        __ptr_01 = *ppSVar5;
        iVar39 = 0;
        goto LAB_00142b23;
      }
      bVar22 = true;
    }
    pSVar28 = __ptr_01->snode;
    local_188.s = (pSVar28->loc).s;
    local_188.pathname = (pSVar28->loc).pathname;
    local_188.ws = (pSVar28->loc).ws;
    local_188.col = (pSVar28->loc).col;
    local_188.line = (pSVar28->loc).line;
    local_158.s = (char *)0x0;
    iVar43 = 0;
    uVar51 = 0;
    pSVar53 = __ptr_01;
    do {
      pSVar28 = pSVar53->snode;
      uVar56 = uVar51;
      if ((pSVar28->loc).s != pcVar11) break;
      iVar49 = (int)uVar51;
      uVar50 = p->t->nsymbols;
      pSVar41 = pSVar53;
      if ((uint)(p->nshift_results - iVar49) < uVar50 * 2) {
        iVar27 = uVar50 * 3 + iVar49;
        p->nshift_results = iVar27;
        pSVar35 = (ShiftResult *)realloc(p->shift_results,(long)iVar27 * 0x30);
        p->shift_results = pSVar35;
        pSVar41 = p->shifts_todo;
        pSVar28 = pSVar53->snode;
      }
      p->shifts_todo = pSVar41->next;
      p->scans = p->scans + 1;
      pDVar19 = pSVar28->state;
      if (pDVar19->scanner_code != (D_ScanCode)0x0) {
        pDVar36 = p->code_shifts;
        if (p->ncode_shifts <= iVar43) {
          p->ncode_shifts = iVar43 + 2;
          pDVar36 = (D_Shift *)realloc(pDVar36,(long)(iVar43 + 2) * 0x18);
          p->code_shifts = pDVar36;
        }
        pDVar36[iVar43].shift_kind = '\0';
        pDVar36[iVar43].op_assoc = '\0';
        pDVar36 = pDVar36 + iVar43;
        pDVar36->term_priority = 0;
        pDVar36->action_index = 0;
        *(D_ReductionCode *)(&pDVar36->term_priority + 2) = (D_ReductionCode)0x0;
        pSVar35 = p->shift_results;
        pdVar21 = &pSVar35[uVar51].loc;
        *(undefined4 *)&pdVar21->ws = local_188.ws._0_4_;
        *(undefined4 *)((long)&pdVar21->ws + 4) = local_188.ws._4_4_;
        *(int *)(&pdVar21->ws + 1) = local_188.col;
        pdVar21->line = local_188.line;
        pdVar21 = &pSVar35[uVar51].loc;
        *(undefined4 *)&pdVar21->s = local_188.s._0_4_;
        *(undefined4 *)((long)&pdVar21->s + 4) = local_188.s._4_4_;
        *(undefined4 *)&pdVar21->pathname = local_188.pathname._0_4_;
        *(undefined4 *)((long)&pdVar21->pathname + 4) = local_188.pathname._4_4_;
        pDVar36 = p->code_shifts;
        iVar27 = (*pDVar19->scanner_code)
                           (&p->shift_results[uVar51].loc,&pDVar36[iVar43].symbol,
                            &pDVar36[iVar43].term_priority,&pDVar36[iVar43].op_assoc,
                            &pDVar36[iVar43].op_priority);
        if (iVar27 != 0) {
          pSVar35 = p->shift_results;
          pSVar35[uVar51].snode = pSVar53->snode;
          uVar56 = (ulong)(iVar49 + 1);
          pSVar35[uVar51].shift = p->code_shifts + iVar43;
          iVar43 = iVar43 + 1;
        }
      }
      if (pDVar19->scanner_table != (void *)0x0) {
        iVar49 = (int)uVar56;
        uVar50 = scan_buffer(&local_188,pDVar19,p->shift_results + uVar56);
        if (uVar50 != 0) {
          pSVar28 = pSVar53->snode;
          pSVar35 = p->shift_results;
          uVar51 = (ulong)uVar50;
          do {
            pSVar35[uVar56].snode = pSVar28;
            uVar56 = (ulong)((int)uVar56 + 1);
            uVar51 = uVar51 - 1;
          } while (uVar51 != 0);
        }
        uVar56 = (ulong)(iVar49 + uVar50);
      }
      pSVar53 = *ppSVar5;
      uVar51 = uVar56;
    } while (pSVar53 != (Shift *)0x0);
    iVar43 = (int)uVar56;
    if (iVar43 != 0) {
      pSVar35 = p->shift_results;
      ppDVar42 = &pSVar35[1].shift;
      lVar44 = 0;
      uVar51 = 0;
      do {
        iVar43 = iVar43 + -1;
        pDVar36 = pSVar35[uVar51].shift;
        if (pDVar36 != (D_Shift *)0x0) {
          pSVar45 = pSVar35 + uVar51;
          if (pDVar36->shift_kind == '\x03') {
            uVar9 = pDVar36->symbol;
            pSVar28 = pSVar45->snode;
            pSVar45->shift = (D_Shift *)0x0;
            ppDVar55 = ppDVar42;
            iVar49 = iVar43;
            if (uVar51 + 1 < uVar56) {
              do {
                pDVar36 = *ppDVar55;
                if (((pDVar36 != (D_Shift *)0x0) &&
                    (pSVar28 == ((ShiftResult *)(ppDVar55 + -1))->snode)) &&
                   (uVar9 == pDVar36->symbol)) {
                  pSVar45->shift = pDVar36;
                  *ppDVar55 = (D_Shift *)0x0;
                }
                iVar49 = iVar49 + -1;
                ppDVar55 = ppDVar55 + 6;
              } while (iVar49 != 0);
              pDVar36 = pSVar45->shift;
              if (pDVar36 != (D_Shift *)0x0) goto LAB_00142e1a;
            }
          }
          else {
LAB_00142e1a:
            if (pDVar36->term_priority != 0) {
              lVar48 = 0;
              do {
                lVar20 = *(long *)((long)&pSVar35->shift + lVar48);
                if (((lVar20 != 0) && (lVar44 != lVar48)) &&
                   ((pSVar45->loc).s == *(char **)((long)&(pSVar35->loc).s + lVar48))) {
                  iVar49 = *(int *)(lVar20 + 8);
                  iVar27 = pSVar45->shift->term_priority;
                  if (iVar27 < iVar49) {
                    pSVar45->shift = (D_Shift *)0x0;
                    break;
                  }
                  if (iVar49 < iVar27) {
                    *(undefined8 *)((long)&pSVar35->shift + lVar48) = 0;
                  }
                }
                lVar48 = lVar48 + 0x30;
              } while (uVar56 * 0x30 != lVar48);
            }
          }
        }
        uVar51 = uVar51 + 1;
        ppDVar42 = ppDVar42 + 6;
        lVar44 = lVar44 + 0x30;
      } while (uVar51 != uVar56);
      lVar44 = 0;
      do {
        pSVar35 = p->shift_results;
        pDVar36 = *(D_Shift **)((long)&pSVar35->shift + lVar44);
        if (pDVar36 != (D_Shift *)0x0) {
          p->shifts = p->shifts + 1;
          pdVar21 = *(d_loc_t **)((long)&pSVar35->snode + lVar44);
          pPVar29 = add_PNode(p,(uint)pDVar36->symbol,pdVar21,
                              *(char **)((long)&(pSVar35->loc).s + lVar44),
                              *(PNode **)&pdVar21[1].col,(D_Reduction *)0x0,(VecZNode *)0x0,pDVar36)
          ;
          if (pPVar29 != (PNode *)0x0) {
            plVar57 = (long *)((long)&(pSVar35->loc).s + lVar44);
            if ((local_158.s == (char *)0x0) || (local_158.s != (char *)*plVar57)) {
              local_158.s = (char *)*plVar57;
              local_158.pathname._0_4_ = *(undefined4 *)((long)&(pSVar35->loc).pathname + lVar44);
              local_158.pathname._4_4_ =
                   *(undefined4 *)((long)&(pSVar35->loc).pathname + lVar44 + 4);
              local_158.ws = *(char **)((long)&(pSVar35->loc).ws + lVar44);
              local_158.col = *(int *)((long)&(pSVar35->loc).col + lVar44);
              local_158.line = *(int *)((long)&(pSVar35->loc).line + lVar44);
              (*(p->user).initial_white_space_fn)(&p->user,&local_158,(void **)p);
              local_158.ws = (char *)*plVar57;
              pPVar29->ws_before = local_188.ws;
              pPVar29->ws_after = local_158.s;
            }
            goto_PNode(p,&local_158,pPVar29,*(SNode **)((long)&pSVar35->snode + lVar44));
          }
        }
        lVar44 = lVar44 + 0x30;
      } while (uVar56 * 0x30 != lVar44);
    }
    do {
      pSVar28 = __ptr_01->snode;
      if ((pSVar28->loc).s != pcVar11) break;
      pSVar53 = __ptr_01->next;
      puVar1 = &pSVar28->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_SNode(p,pSVar28);
      }
      __ptr_01->next = p->free_shifts;
      p->free_shifts = __ptr_01;
      __ptr_01 = pSVar53;
    } while (pSVar53 != (Shift *)0x0);
    iVar43 = iVar39;
    if (((bVar22) && (pRVar33 = p->reductions_todo, pRVar33 != (Reduction *)0x0)) &&
       (pRVar33->next == (Reduction *)0x0)) {
      iVar39 = commit_stack(p,pRVar33->snode);
      iVar43 = 0;
      if (iVar39 == -4) {
        return -1;
      }
    }
  } while( true );
}

Assistant:

static int exhaustive_parse(Parser *p, int state) {
  Reduction *r;
  char *pos, *epos = NULL;
  PNode *pn, tpn;
  SNode *sn;
  ZNode *z;
  int progress = 0, ready = 0;
  d_loc_t loc;

  pos = p->user.loc.ws = p->user.loc.s = p->start;
  loc = p->user.loc;
  p->user.initial_white_space_fn((D_Parser *)p, &loc, &p->user.initial_globals);
  /* initial state */
  sn = add_SNode(p, &p->t->state[state], &loc, p->top_scope);
  memset(&tpn, 0, sizeof(tpn));
  tpn.initial_scope = tpn.parse_node.scope = p->top_scope;
  tpn.parse_node.end = loc.s;
  if (sn->last_pn) unref_pn(p, sn->last_pn);
  pn = add_PNode(p, 0, &loc, loc.s, &tpn, 0, 0, 0);
  ref_pn(pn);
  sn->last_pn = pn;
  set_add_znode(&sn->zns, (z = new_ZNode(p, pn)));
  while (1) {
    /* reduce all */
    while (p->reductions_todo) {
      pos = p->reductions_todo->snode->loc.s;
      if (p->shifts_todo && p->shifts_todo->snode->loc.s < pos) break;
      if (pos > epos) {
        epos = pos;
        free_old_nodes(p);
      }
      for (; (r = p->reductions_todo) && r->snode->loc.s == pos;) {
        p->reductions_todo = p->reductions_todo->next;
        reduce_one(p, r);
      }
    }
    /* done? */
    if (!p->shifts_todo) {
      if (p->accept && (p->accept->loc.s == p->end || p->user.partial_parses))
        return 0;
      else {
        if (error_recovery(p)) return 1;
        continue;
      }
    } else if (!p->user.dont_compare_stacks && p->shifts_todo->next)
      cmp_stacks(p);
    /* shift all */
    pos = p->shifts_todo->snode->loc.s;
    if (pos > epos) {
      epos = pos;
      free_old_nodes(p);
    }
    progress++;
    ready = progress > p->user.commit_actions_interval;
    if (ready && !p->shifts_todo->next && !p->reductions_todo) {
      if (commit_stack(p, p->shifts_todo->snode) == -4)
        return -1;
      ready = progress = 0;
    }
    shift_all(p, pos);
    if (ready && p->reductions_todo && !p->reductions_todo->next) {
      if (commit_stack(p, p->reductions_todo->snode) == -4)
        return -1;
      progress = 0;
    }
  }
}